

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O3

QWindow * __thiscall QWidgetPrivate::windowHandle(QWidgetPrivate *this,WindowHandleMode mode)

{
  long *plVar1;
  long *plVar2;
  QWExtra *pQVar3;
  tuple<QTLWExtra_*,_std::default_delete<QTLWExtra>_> tVar4;
  QWindow *pQVar5;
  long lVar6;
  long lVar7;
  
  if (mode < TopLevel) {
    pQVar3 = (this->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
             super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
             super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl;
    if ((pQVar3 == (QWExtra *)0x0) ||
       (tVar4.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
        super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
             *(_Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_> *)
              &(pQVar3->topextra)._M_t.
               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>,
       tVar4.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl ==
       (_Head_base<0UL,_QTLWExtra_*,_false>)0x0)) {
      if (mode != Closest) {
        return (QWindow *)0x0;
      }
    }
    else {
      pQVar5 = *(QWindow **)
                ((long)tVar4.super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                       super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0x20);
      if (mode == Direct) {
        return pQVar5;
      }
      if (pQVar5 != (QWindow *)0x0) {
        return pQVar5;
      }
    }
    lVar7 = *(long *)&this->field_0x8;
    do {
      lVar7 = *(long *)(*(long *)(lVar7 + 8) + 0x10);
      if (lVar7 == 0) goto LAB_002f739e;
    } while (**(long **)(lVar7 + 0x20) == 0);
    lVar7 = *(long *)(*(long *)(lVar7 + 8) + 0x78);
    if (((lVar7 != 0) && (lVar7 = *(long *)(lVar7 + 8), lVar7 != 0)) &&
       (pQVar5 = *(QWindow **)(lVar7 + 0x20), pQVar5 != (QWindow *)0x0)) {
      return pQVar5;
    }
  }
LAB_002f739e:
  if (mode - Closest < 2) {
    lVar7 = *(long *)&this->field_0x8;
    do {
      plVar1 = (long *)(lVar7 + 8);
      lVar6 = *(long *)(*plVar1 + 0x10);
      if (lVar6 == 0) break;
      plVar2 = (long *)(lVar7 + 0x20);
      lVar7 = lVar6;
    } while ((*(uint *)(*plVar2 + 0xc) & 1) == 0);
    lVar7 = *(long *)(*plVar1 + 0x78);
    if (((lVar7 != 0) && (lVar7 = *(long *)(lVar7 + 8), lVar7 != 0)) &&
       (pQVar5 = *(QWindow **)(lVar7 + 0x20), pQVar5 != (QWindow *)0x0)) {
      return pQVar5;
    }
  }
  return (QWindow *)0x0;
}

Assistant:

QWindow *QWidgetPrivate::windowHandle(WindowHandleMode mode) const
{
    if (mode == WindowHandleMode::Direct || mode == WindowHandleMode::Closest) {
        if (QTLWExtra *x = maybeTopData()) {
            if (x->window != nullptr || mode == WindowHandleMode::Direct)
                return x->window;
        }
    }
    if (mode == WindowHandleMode::Closest) {
        // FIXME: Use closestParentWidgetWithWindowHandle instead
        if (auto nativeParent = q_func()->nativeParentWidget()) {
            if (auto window = nativeParent->windowHandle())
                return window;
        }
    }
    if (mode == WindowHandleMode::TopLevel || mode == WindowHandleMode::Closest) {
        if (auto topLevel = q_func()->topLevelWidget()) {
            if (auto window = topLevel ->windowHandle())
                return window;
        }
    }
    return nullptr;
}